

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDA.hpp
# Opt level: O0

void __thiscall PCCompatible::MDA::~MDA(MDA *this)

{
  MDA *this_local;
  
  CRTCOutputter::~CRTCOutputter(&this->outputter_);
  return;
}

Assistant:

MDA() : crtc_(outputter_) {}